

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,BYTE *ip)

{
  void *ptr;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  int in_ESI;
  long in_RDI;
  size_t hash3;
  U32 target;
  U32 idx;
  BYTE *base;
  U32 hashLog3;
  U32 *hashTable3;
  U32 in_stack_ffffffffffffffbc;
  uint uVar4;
  void *in_stack_ffffffffffffffc0;
  void *pvVar5;
  undefined4 local_2c;
  
  ptr = *(void **)(in_RDI + 0x38);
  local_2c = *(uint *)(in_RDI + 0x28);
  uVar1 = in_ESI - (int)*(undefined8 *)(in_RDI + 8);
  *(uint *)(in_RDI + 0x28) = uVar1;
  sVar2 = ZSTD_hash3Ptr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  for (; local_2c < uVar1; local_2c = local_2c + 1) {
    uVar4 = local_2c;
    pvVar5 = ptr;
    sVar3 = ZSTD_hash3Ptr(ptr,local_2c);
    *(uint *)((long)pvVar5 + sVar3 * 4) = uVar4;
  }
  return *(U32 *)((long)ptr + sVar2 * 4);
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (ZSTD_matchState_t* ms, const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = ms->nextToUpdate3;
    U32 const target = ms->nextToUpdate3 = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    return hashTable3[hash3];
}